

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O3

void helper_gvec_fcmlas_idx_arm(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float32 fVar6;
  float32 fVar7;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uintptr_t i;
  ulong local_80;
  ulong uVar8;
  
  uVar4 = desc * 8 & 0xff;
  uVar5 = uVar4 + 8;
  uVar8 = (ulong)uVar5;
  uVar12 = desc >> 10 & 1;
  uVar13 = desc >> 0xb;
  local_80 = 0;
  do {
    lVar9 = (uVar13 & 6) + local_80;
    uVar1 = *(uint *)((long)vm + lVar9 * 4);
    uVar2 = *(uint *)((long)vm + lVar9 * 4 + 4);
    uVar3 = uVar2;
    if (uVar12 != 0) {
      uVar3 = uVar1;
      uVar1 = uVar2;
    }
    uVar10 = local_80 + 4;
    do {
      fVar7 = *(float32 *)((long)vn + local_80 * 4 + (ulong)uVar12 * 4);
      fVar6 = float32_muladd_arm(fVar7,uVar1 ^ (desc >> 10 ^ uVar13) << 0x1f,
                                 *(float32 *)((long)vd + local_80 * 4),0,(float_status *)vfpst);
      *(float32 *)((long)vd + local_80 * 4) = fVar6;
      fVar7 = float32_muladd_arm(fVar7,uVar3 ^ uVar13 << 0x1f,
                                 *(float32 *)((long)vd + local_80 * 4 + 4),0,(float_status *)vfpst);
      *(float32 *)((long)vd + local_80 * 4 + 4) = fVar7;
      local_80 = local_80 + 2;
    } while (local_80 < uVar10);
    local_80 = uVar10;
  } while (uVar10 < uVar5 >> 2);
  uVar5 = desc >> 2 & 0xf8;
  if (uVar4 < uVar5) {
    uVar11 = (ulong)(uVar5 + 8);
    uVar10 = uVar8 + 8;
    if (uVar8 + 8 < uVar11) {
      uVar10 = uVar11;
    }
    memset((void *)((long)vd + uVar8),0,(~uVar8 + uVar10 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_fcmlas_idx)(void *vd, void *vn, void *vm,
                             void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float32 *d = vd;
    float32 *n = vn;
    float32 *m = vm;
    float_status *fpst = vfpst;
    intptr_t flip = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    intptr_t index = extract32(desc, SIMD_DATA_SHIFT + 2, 2);
    uint32_t neg_real = flip ^ neg_imag;
    intptr_t elements = opr_sz / sizeof(float32);
    intptr_t eltspersegment = 16 / sizeof(float32);
    intptr_t i, j;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 31;
    neg_imag <<= 31;

    for (i = 0; i < elements; i += eltspersegment) {
        float32 mr = m[H4(i + 2 * index + 0)];
        float32 mi = m[H4(i + 2 * index + 1)];
        float32 e1 = neg_real ^ (flip ? mi : mr);
        float32 e3 = neg_imag ^ (flip ? mr : mi);

        for (j = i; j < i + eltspersegment; j += 2) {
            float32 e2 = n[H4(j + flip)];
            float32 e4 = e2;

            d[H4(j)] = float32_muladd(e2, e1, d[H4(j)], 0, fpst);
            d[H4(j + 1)] = float32_muladd(e4, e3, d[H4(j + 1)], 0, fpst);
        }
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}